

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlZMemBuffExtend(xmlZMemBuffPtr buff,size_t ext_amt)

{
  long lVar1;
  size_t sVar2;
  xmlChar local_238 [8];
  xmlChar msg [500];
  uchar *tmp_ptr;
  size_t cur_used;
  size_t new_size;
  int rc;
  size_t ext_amt_local;
  xmlZMemBuffPtr buff_local;
  
  new_size._4_4_ = -1;
  stack0xffffffffffffffc0 = (uchar *)0x0;
  if (buff == (xmlZMemBuffPtr)0x0) {
    buff_local._4_4_ = -1;
  }
  else if (ext_amt == 0) {
    buff_local._4_4_ = 0;
  }
  else {
    lVar1 = (long)(buff->zctrl).next_out - (long)buff->zbuff;
    sVar2 = buff->size + ext_amt;
    register0x00000000 = (uchar *)(*xmlRealloc)(buff->zbuff,sVar2);
    if (register0x00000000 == (uchar *)0x0) {
      xmlStrPrintf(local_238,500,"xmlZMemBuffExtend:  %s %lu bytes.\n",
                   "Allocation failure extending output buffer to",sVar2);
      xmlIOErr(0x60a,(char *)local_238);
    }
    else {
      new_size._4_4_ = 0;
      buff->size = sVar2;
      buff->zbuff = register0x00000000;
      (buff->zctrl).next_out = register0x00000000 + lVar1;
      (buff->zctrl).avail_out = (int)sVar2 - (int)lVar1;
    }
    buff_local._4_4_ = new_size._4_4_;
  }
  return buff_local._4_4_;
}

Assistant:

static int
xmlZMemBuffExtend( xmlZMemBuffPtr buff, size_t ext_amt ) {

    int			rc = -1;
    size_t		new_size;
    size_t		cur_used;

    unsigned char *	tmp_ptr = NULL;

    if ( buff == NULL )
	return ( -1 );

    else if ( ext_amt == 0 )
	return ( 0 );

    cur_used = buff->zctrl.next_out - buff->zbuff;
    new_size = buff->size + ext_amt;

#ifdef DEBUG_HTTP
    if ( cur_used > new_size )
	xmlGenericError( xmlGenericErrorContext,
			"xmlZMemBuffExtend:  %s\n%s %d bytes.\n",
			"Buffer overwrite detected during compressed memory",
			"buffer extension.  Overflowed by",
			(cur_used - new_size ) );
#endif

    tmp_ptr = xmlRealloc( buff->zbuff, new_size );
    if ( tmp_ptr != NULL ) {
	rc = 0;
	buff->size  = new_size;
	buff->zbuff = tmp_ptr;
	buff->zctrl.next_out  = tmp_ptr + cur_used;
	buff->zctrl.avail_out = new_size - cur_used;
    }
    else {
	xmlChar msg[500];
	xmlStrPrintf(msg, 500,
		    "xmlZMemBuffExtend:  %s %lu bytes.\n",
		    "Allocation failure extending output buffer to",
		    (unsigned long) new_size );
	xmlIOErr(XML_IO_WRITE, (const char *) msg);
    }

    return ( rc );
}